

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserProbModelXML.cpp
# Opt level: O0

void __thiscall ParserProbModelXML::ReadAgents(ParserProbModelXML *this)

{
  xmlChar *in_RDI;
  xmlNodePtr unaff_retaddr;
  ParserProbModelXML *in_stack_00000008;
  string *in_stack_00000048;
  MultiAgentDecisionProcess *in_stack_00000050;
  int i;
  xmlNodeSetPtr nodeset;
  xmlXPathObjectPtr agent_nodes;
  xmlChar *xpath;
  xmlNodePtr in_stack_ffffffffffffff98;
  ParserProbModelXML *in_stack_ffffffffffffffa8;
  string local_48 [36];
  int local_24;
  xmlNodeSetPtr local_20;
  xmlXPathObjectPtr local_18;
  char *local_10;
  
  local_10 = "/ProbModelXML/ProbNet/Agents/Agent";
  local_18 = GetNodesMatchingExpression(in_stack_ffffffffffffffa8,in_RDI,in_stack_ffffffffffffff98);
  if ((((in_RDI[0x88] & 1) == 0) && (local_18 != (xmlXPathObjectPtr)0x0)) &&
     (1 < local_18->nodesetval->nodeNr)) {
    local_20 = local_18->nodesetval;
    for (local_24 = 0; local_24 < local_20->nodeNr; local_24 = local_24 + 1) {
      GetVariableName_abi_cxx11_(in_stack_00000008,unaff_retaddr);
      MultiAgentDecisionProcess::AddAgent(in_stack_00000050,in_stack_00000048);
      std::__cxx11::string::~string(local_48);
    }
    xmlXPathFreeObject(local_18);
    in_RDI[0x78] = '\x01';
  }
  else {
    MultiAgentDecisionProcess::SetNrAgents((MultiAgentDecisionProcess *)this,(size_t)xpath);
    xmlXPathFreeObject(local_18);
    in_RDI[0x78] = '\x01';
  }
  return;
}

Assistant:

void ParserProbModelXML::ReadAgents()
{
    xmlChar *xpath = (xmlChar*) "/ProbModelXML/ProbNet/Agents/Agent";
    xmlXPathObjectPtr agent_nodes = GetNodesMatchingExpression(xpath);

    if (_m_asynchronousModel || agent_nodes == NULL || agent_nodes->nodesetval->nodeNr < 2){
        _m_fDecPOMDP->SetNrAgents(1);
        xmlXPathFreeObject (agent_nodes);
        _m_agentsInitialized = true;
        return;
    }
    xmlNodeSetPtr nodeset = agent_nodes->nodesetval;
    for (int i = 0; i < nodeset->nodeNr; i++) {
      _m_fDecPOMDP->AddAgent(GetVariableName(nodeset->nodeTab[i]));
    }
    xmlXPathFreeObject (agent_nodes);
    _m_agentsInitialized = true;
    return;
}